

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.c
# Opt level: O2

void ez_sparse(long i,int_least64_t *ok,long seq)

{
  *ok = (ulong)((uint)i & 7) + (((ulong)i >> 1 & 0x1ffffffffffffffc) + seq) * 8;
  return;
}

Assistant:

void
ez_sparse(long i, DSS_HUGE *ok, long seq)
	{
	long low_bits;
	
	*ok = (DSS_HUGE) i;
	low_bits = (long)(i & ((1 << SPARSE_KEEP) - 1));
	*ok = *ok >> SPARSE_KEEP;
	*ok = *ok << SPARSE_BITS;
	*ok += seq;
	*ok = *ok << SPARSE_KEEP;
	*ok += low_bits;
	
	
	return;
	}